

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  undefined4 uVar1;
  size_t sVar2;
  long in_RDI;
  size_t streamingSize;
  size_t outBuffSize;
  size_t inBuffSize;
  size_t blockSize;
  size_t CCtxSize;
  ZSTD_CCtx_params *in_stack_00000078;
  undefined8 local_40;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0x38) == 0) {
    local_8 = ZSTD_estimateCCtxSize_usingCCtxParams(in_stack_00000078);
    if ((ulong)(1L << ((byte)*(undefined4 *)(in_RDI + 4) & 0x3f)) < 0x20001) {
      local_40 = 1L << ((byte)*(undefined4 *)(in_RDI + 4) & 0x3f);
    }
    else {
      local_40 = 0x20000;
    }
    uVar1 = *(undefined4 *)(in_RDI + 4);
    sVar2 = ZSTD_compressBound(local_40);
    local_8 = local_8 + (1L << ((byte)uVar1 & 0x3f)) + local_40 + sVar2 + 1;
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    if (params->nbWorkers > 0) { return ERROR(GENERIC); }
    {   size_t const CCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(params);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << params->cParams.windowLog);
        size_t const inBuffSize = ((size_t)1 << params->cParams.windowLog) + blockSize;
        size_t const outBuffSize = ZSTD_compressBound(blockSize) + 1;
        size_t const streamingSize = inBuffSize + outBuffSize;

        return CCtxSize + streamingSize;
    }
}